

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamFtp_p.cpp
# Opt level: O3

bool __thiscall
BamTools::Internal::BamFtp::SendCommand(BamFtp *this,string *command,bool waitForReply)

{
  bool bVar1;
  int64_t iVar2;
  string local_60;
  string local_40;
  
  bVar1 = TcpSocket::IsConnected(this->m_commandSocket);
  if (bVar1) {
    iVar2 = WriteCommandSocket(this,(command->_M_dataplus)._M_p,(uint)command->_M_string_length);
    if (iVar2 != -1) {
      if (!waitForReply) {
        return true;
      }
      bVar1 = ReceiveReply(this);
      return bVar1;
    }
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"BamFtp::SendCommand","");
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_60,"error writing to socket","");
    IBamIODevice::SetErrorString(&this->super_IBamIODevice,&local_40,&local_60);
  }
  else {
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"BamFtp::SendCommand","");
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_60,"command socket not connected","");
    IBamIODevice::SetErrorString(&this->super_IBamIODevice,&local_40,&local_60);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  return false;
}

Assistant:

bool BamFtp::SendCommand(const string& command, bool waitForReply) {

    // failure if not connected
    if ( !m_commandSocket->IsConnected() ) {
        SetErrorString("BamFtp::SendCommand", "command socket not connected");
        return false;
    }

    // write command to 'command socket'
    if ( WriteCommandSocket(command.c_str(), command.length()) == -1 ) {
        SetErrorString("BamFtp::SendCommand", "error writing to socket");
        // get actual error from command socket??
        return false;
    }

    // if we sent a command that receives a response
    if ( waitForReply )
        return ReceiveReply();

    // return success
    return true;
}